

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::verifyTestResult
          (TestStatus *__return_storage_ptr__,ComputeCacheTestInstance *this)

{
  VkDevice pVVar1;
  VkDevice pVVar2;
  Allocation *pAVar3;
  VkDeviceSize VVar4;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  uint local_4c;
  void *pvStack_48;
  deUint32 ndx;
  deUint8 *bufCached;
  deUint8 *bufNoCache;
  VkDeviceMemory local_30;
  VkDevice local_28;
  VkDevice vkDevice;
  DeviceInterface *vk;
  ComputeCacheTestInstance *this_local;
  
  vk = (DeviceInterface *)this;
  this_local = (ComputeCacheTestInstance *)__return_storage_ptr__;
  vkDevice = (VkDevice)
             Context::getDeviceInterface
                       ((this->super_CacheTestInstance).super_TestInstance.m_context);
  pVVar2 = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  pVVar1 = vkDevice;
  local_28 = pVVar2;
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this->m_outputBufferAlloc[0].
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  local_30 = ::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this->m_outputBufferAlloc[0].
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar4 = ::vk::Allocation::getOffset(pAVar3);
  ::vk::invalidateMappedMemoryRange((DeviceInterface *)pVVar1,pVVar2,local_30,VVar4,0x800);
  pVVar2 = vkDevice;
  pVVar1 = local_28;
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this->m_outputBufferAlloc[1].
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  bufNoCache = (deUint8 *)::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this->m_outputBufferAlloc[1].
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar4 = ::vk::Allocation::getOffset(pAVar3);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)pVVar2,pVVar1,(VkDeviceMemory)bufNoCache,VVar4,0x800);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this->m_outputBufferAlloc[0].
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  bufCached = (deUint8 *)::vk::Allocation::getHostPtr(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this->m_outputBufferAlloc[1].
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  pvStack_48 = ::vk::Allocation::getHostPtr(pAVar3);
  local_4c = 0;
  while( true ) {
    if (0x7ff < local_4c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Output buffers w/o cached pipeline match.",&local_a9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      return __return_storage_ptr__;
    }
    if (bufCached[local_4c] != *(deUint8 *)((long)pvStack_48 + (ulong)local_4c)) break;
    local_4c = local_4c + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Output buffers w/o cached pipeline mismatch.",&local_71);
  tcu::TestStatus::fail(__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeCacheTestInstance::verifyTestResult (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Read the content of output buffers
	invalidateMappedMemoryRange(vk,
								vkDevice,
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getMemory(),
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getOffset(),
								sizeof(tcu::Vec4) * 128u);

	invalidateMappedMemoryRange(vk,
								vkDevice,
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getMemory(),
								m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getOffset(),
								sizeof(tcu::Vec4) * 128u);
	// Compare the content
	deUint8* bufNoCache = reinterpret_cast<deUint8*>(m_outputBufferAlloc[PIPELINE_CACHE_NDX_NO_CACHE]->getHostPtr());
	deUint8* bufCached  = reinterpret_cast<deUint8*>(m_outputBufferAlloc[PIPELINE_CACHE_NDX_CACHED]->getHostPtr());
	for (deUint32 ndx = 0u; ndx < sizeof(tcu::Vec4) * 128u; ndx++)
	{
		if (bufNoCache[ndx] != bufCached[ndx])
		{
			return tcu::TestStatus::fail("Output buffers w/o cached pipeline mismatch.");
		}
	}

	return tcu::TestStatus::pass("Output buffers w/o cached pipeline match.");
}